

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O1

int lib::table::Insert(State *state)

{
  size_t index_00;
  bool bVar1;
  int iVar2;
  Table *this;
  Value *value;
  int index_01;
  size_t index;
  StackAPI api;
  size_t local_38;
  StackAPI local_30;
  
  luna::StackAPI::StackAPI(&local_30,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&local_30,2,ValueT_Table);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = luna::StackAPI::GetStackSize(&local_30);
    this = luna::StackAPI::GetTable(&local_30,0);
    local_38 = luna::Table::ArraySize(this);
    local_38 = local_38 + 1;
    index_01 = 1;
    if (2 < iVar2) {
      bVar1 = GetNumber<unsigned_long>(&local_30,1,&local_38);
      index_01 = 2;
      if (!bVar1) {
        return 0;
      }
    }
    index_00 = local_38;
    value = luna::StackAPI::GetValue(&local_30,index_01);
    bVar1 = luna::Table::InsertArrayValue(this,index_00,value);
    luna::StackAPI::PushBool(&local_30,bVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Insert(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table))
            return 0;

        auto params = api.GetStackSize();
        auto table = api.GetTable(0);
        auto index = table->ArraySize() + 1;
        int value = 1;

        if (params > 2)
        {
            if (!GetNumber(api, 1, index))
                return 0;

            value = 2;
        }

        api.PushBool(table->InsertArrayValue(index, *api.GetValue(value)));
        return 1;
    }